

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O3

void __thiscall YsSoundPlayer::APISpecificData::DiscardEnded(APISpecificData *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  pointer pPVar4;
  pointer pPVar5;
  ulong uVar6;
  ulong uVar7;
  
  pPVar4 = (this->playing).
           super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar5 = (this->playing).
           super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (long)pPVar5 - (long)pPVar4) {
    uVar6 = (ulong)((long)pPVar5 - (long)pPVar4) / 0x18;
    uVar7 = uVar6 + 1;
    lVar1 = uVar6 * 0x18;
    do {
      pPVar4 = (this->playing).
               super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&pPVar4[-1].dat + lVar1) == 0) {
        puVar3 = (undefined8 *)((long)&pPVar4[-1].dat + lVar1);
        pPVar4 = (this->playing).
                 super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        puVar3[2] = *(undefined8 *)&pPVar4[-1].stop;
        uVar2 = *(undefined8 *)&pPVar4[-1].ptr;
        *puVar3 = pPVar4[-1].dat;
        puVar3[1] = uVar2;
        std::
        vector<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
        ::resize(&this->playing,
                 ((long)(this->playing).
                        super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->playing).
                        super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1);
      }
      uVar7 = uVar7 - 1;
      lVar1 = lVar1 + -0x18;
    } while (1 < uVar7);
    pPVar4 = (this->playing).
             super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar5 = (this->playing).
             super__Vector_base<YsSoundPlayer::APISpecificData::PlayingSound,_std::allocator<YsSoundPlayer::APISpecificData::PlayingSound>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pPVar5 != pPVar4) {
    return;
  }
  snd_pcm_drop(this->handle);
  return;
}

Assistant:

void YsSoundPlayer::APISpecificData::DiscardEnded(void)
{
	for(long long int i=playing.size()-1; 0<=i; --i)
	{
		if(nullptr==playing[i].dat)
		{
			playing[i]=playing.back();
			playing.resize(playing.size()-1);
		}
	}

	if(0==playing.size())
	{
		snd_pcm_drop(handle);
	}
}